

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_bin.c
# Opt level: O0

void test_read_format_cpio_bin(void)

{
  archive *paVar1;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *a;
  archive_entry *ae;
  void *in_stack_00000020;
  archive *in_stack_ffffffffffffffe8;
  archive *paVar2;
  wchar_t in_stack_fffffffffffffff8;
  wchar_t in_stack_fffffffffffffffc;
  
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)paVar1,in_stack_ffffffffffffffe8);
  archive_read_support_filter_all(in_stack_ffffffffffffffe8);
  paVar2 = paVar1;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x171150,in_stack_00000020);
  archive_read_support_format_all(paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2,
                      (longlong)paVar2,(char *)0x171189,in_stack_00000020);
  archive_read_open_memory(paVar1,paVar2,0x17119f);
  paVar2 = paVar1;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x1711ce,in_stack_00000020);
  archive_read_next_header(paVar2,(archive_entry **)paVar1);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2,
                      (longlong)paVar2,(char *)0x17120c,in_stack_00000020);
  archive_file_count(paVar2);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2,0
                      ,(char *)0x171247,in_stack_00000020);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2,0
                      ,(char *)0x171280,in_stack_00000020);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  paVar1 = paVar2;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2,
                      (longlong)paVar2,(char *)0x1712bc,in_stack_00000020);
  archive_filter_code(paVar1,(int)((ulong)paVar2 >> 0x20));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x1712f7,in_stack_00000020);
  archive_format(paVar1);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x171331,in_stack_00000020);
  archive_read_close((archive *)0x17133b);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x17136a,in_stack_00000020);
  archive_read_free((archive *)0x171374);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,0
                      ,(char *)0x1713a2,in_stack_00000020);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_bin)
{
	struct archive_entry *ae;
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CPIO_BIN_LE, archive_format(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}